

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSocket.cc
# Opt level: O0

ssize_t __thiscall ClientSocket::write(ClientSocket *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  void *__buf_00;
  size_t __n_00;
  runtime_error *this_00;
  int *piVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  allocator local_41;
  string local_40 [32];
  ssize_t local_20;
  ssize_t result;
  string *data_local;
  ClientSocket *this_local;
  
  result = CONCAT44(in_register_00000034,__fd);
  __fd_00 = this->_fileDescriptor;
  data_local = (string *)this;
  __buf_00 = (void *)std::__cxx11::string::c_str();
  __n_00 = std::__cxx11::string::size();
  local_20 = send(__fd_00,__buf_00,__n_00,0);
  if (local_20 == -1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar2,&local_41);
    std::runtime_error::runtime_error(this_00,local_40);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_20;
}

Assistant:

void ClientSocket::write( const std::string& data )
{
  auto result = send( _fileDescriptor,
                      reinterpret_cast<const void*>( data.c_str() ),
                      data.size(),
                      0 );

  if( result == -1 )
    throw std::runtime_error( std::string( strerror( errno ) ) );
}